

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall DnsStats::RegisterEdnsUsage(DnsStats *this,uint32_t flags,uint32_t *e_rcode)

{
  ulong uVar1;
  uint32_t uVar2;
  int i;
  uint uVar3;
  bool stored;
  bool local_99;
  DnsHashEntry local_98;
  
  uVar1 = (ulong)(flags | 0x8000);
  if (this->dnssec_packet == (uint8_t *)0x0) {
    uVar1 = (ulong)flags;
  }
  if (e_rcode != (uint32_t *)0x0) {
    *e_rcode = (uint32_t)(uVar1 >> 0x18);
  }
  this->is_using_edns = true;
  this->is_do_flag_set = (bool)((byte)(uVar1 >> 0xf) & 1);
  uVar3 = 0;
  uVar2 = 0xf;
  do {
    if (((uint)uVar1 >> (uVar3 & 0x1f) & 1) != 0) {
      local_98.HashNext = (DnsHashEntry *)0x0;
      local_99 = false;
      local_98.count = 1;
      local_98.hash = 0;
      local_98.registry_id = 10;
      local_98.key_type = 0;
      local_98.key_length = 4;
      local_98.field_6.key_number = uVar2;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
    }
    uVar3 = uVar3 + 1;
    uVar2 = uVar2 - 1;
  } while (uVar3 != 0x10);
  local_98.field_6.key_number = (uint)uVar1 >> 0x10 & 0xff;
  local_98.HashNext = (DnsHashEntry *)0x0;
  local_99 = false;
  local_98.count = 1;
  local_98.hash = 0;
  local_98.registry_id = 0xb;
  local_98.key_type = 0;
  local_98.key_length = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_98,true,&local_99);
  return;
}

Assistant:

void DnsStats::RegisterEdnsUsage(uint32_t flags, uint32_t* e_rcode)
{
    /* Little safety because flags are set differently for some packets */
    if (dnssec_packet != NULL) {
        flags |= (1 << 15);
    }
    /* Process the flags and rcodes */
    if (e_rcode != NULL)
    {
        *e_rcode = (flags >> 24) & 0xFF;
    }

    /* Register that EDNS was used */
    is_using_edns = true;

    /* Register whether the DO bit was set */
    is_do_flag_set = (flags & (1 << 15)) != 0;

    /* Add flags to registration */
    for (int i = 0; i < 16; i++)
    {
        if ((flags & (1 << i)) != 0)
        {
            SubmitRegistryNumber(REGISTRY_EDNS_Header_Flags, 15 - i);
        }
    }

    SubmitRegistryNumber(REGISTRY_EDNS_Version_number, (flags >> 16) & 0xFF);
}